

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O2

void anon_unknown.dwarf_3ea68::writeModule(Module *wasm,string *filename,WasmSplitOptions *options)

{
  ModuleWriter local_a8;
  string local_30 [32];
  
  local_a8.options = &(options->super_ToolOptions).passOptions;
  local_a8.symbolMap._M_dataplus._M_p = (pointer)&local_a8.symbolMap.field_2;
  local_a8.symbolMap._M_string_length = 0;
  local_a8.symbolMap.field_2._M_local_buf[0] = '\0';
  local_a8.sourceMapFilename._M_dataplus._M_p = (pointer)&local_a8.sourceMapFilename.field_2;
  local_a8.sourceMapFilename._M_string_length = 0;
  local_a8.sourceMapFilename.field_2._M_local_buf[0] = '\0';
  local_a8.sourceMapUrl._M_dataplus._M_p = (pointer)&local_a8.sourceMapUrl.field_2;
  local_a8.sourceMapUrl._M_string_length = 0;
  local_a8.sourceMapUrl.field_2._M_local_buf[0] = '\0';
  local_a8.binary = options->emitBinary;
  local_a8.super_ModuleIOBase.debugInfo = (options->super_ToolOptions).passOptions.debugInfo;
  local_a8.emitModuleName = options->emitModuleNames == true;
  std::__cxx11::string::string(local_30,(string *)filename);
  ::wasm::ModuleWriter::write(&local_a8,wasm,local_30);
  std::__cxx11::string::~string(local_30);
  ::wasm::ModuleWriter::~ModuleWriter(&local_a8);
  return;
}

Assistant:

void writeModule(Module& wasm,
                 std::string filename,
                 const WasmSplitOptions& options) {
  ModuleWriter writer(options.passOptions);
  writer.setBinary(options.emitBinary);
  writer.setDebugInfo(options.passOptions.debugInfo);
  if (options.emitModuleNames) {
    writer.setEmitModuleName(true);
  }
  writer.write(wasm, filename);
}